

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryTransfer
          (InMemoryDirectory *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,
          PathPtr fromPath,TransferMode mode)

{
  ArrayDisposer **this_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  Impl *pIVar4;
  String *pSVar5;
  NullableValue<kj::FsNode::Metadata> *other;
  Metadata *pMVar6;
  Metadata *__src;
  Own<const_kj::File,_std::nullptr_t> *pOVar7;
  OwnOwn<const_kj::File,_std::nullptr_t> *pOVar8;
  File *pFVar9;
  RefOrVoid<const_kj::File> pFVar10;
  Own<const_kj::Directory,_std::nullptr_t> *pOVar11;
  OwnOwn<const_kj::Directory,_std::nullptr_t> *pOVar12;
  RefOrVoid<const_kj::Directory> pDVar13;
  NullableValue<kj::String> *pNVar14;
  EntryImpl *this_01;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  *ctx;
  Directory *pDVar15;
  PathPtr PVar16;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  Own<const_kj::Directory,_std::nullptr_t> *child;
  WriteMode local_448;
  undefined1 local_440 [16];
  undefined1 local_430 [8];
  OwnOwn<const_kj::Directory,_std::nullptr_t> _child1382;
  EntryImpl *targetEntry;
  WriteMode local_410;
  undefined1 local_408 [16];
  EntryImpl *_targetEntry1370;
  undefined1 local_3f0 [8];
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Fault f_2;
  bool local_3c2;
  DebugExpression<bool> local_3c1;
  DebugExpression<bool> _kjCondition;
  Fault f_1;
  String local_3b0;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  local_398;
  Fault local_370;
  _Rb_tree_color local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  Maybe<kj::String> local_350;
  undefined1 local_330 [8];
  NullableValue<kj::String> _kj_result_2;
  undefined1 local_2f0 [8];
  String link;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  local_2c8;
  undefined1 local_2a0 [24];
  Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory_&> local_288;
  undefined1 local_280 [24];
  _Rb_tree_color local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> local_258;
  undefined1 local_248 [8];
  OwnOwn<const_kj::Directory,_std::nullptr_t> _kj_result_1;
  undefined1 local_228 [8];
  Own<const_kj::Directory,_std::nullptr_t> subdir;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  local_208;
  undefined1 local_1e0 [8];
  Own<const_kj::File,_std::nullptr_t> copy;
  Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> local_1b8;
  undefined1 local_1a8 [8];
  OwnOwn<const_kj::File,_std::nullptr_t> _kj_result;
  undefined1 local_188 [8];
  Own<const_kj::File,_std::nullptr_t> file;
  Metadata *m;
  Maybe<kj::FsNode::Metadata> local_158;
  undefined1 local_120 [8];
  NullableValue<kj::FsNode::Metadata> _m1292;
  Metadata meta;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  newNode;
  StringPtr local_88;
  undefined1 local_70 [40];
  Fault local_48;
  Fault f;
  TransferMode mode_local;
  Directory *fromDirectory_local;
  WriteMode toMode_local;
  InMemoryDirectory *this_local;
  PathPtr toPath_local;
  
  toPath_local.parts.ptr = (String *)toPath.parts.size_;
  this_local = (InMemoryDirectory *)toPath.parts.ptr;
  f.exception._4_4_ = mode;
  sVar3 = PathPtr::size((PathPtr *)&this_local);
  if (sVar3 == 0) {
    bVar1 = has<kj::WriteMode,void>(toMode,CREATE);
    if (bVar1) {
      toPath_local.parts.size_._7_1_ = 0;
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                (&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4fe,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      toPath_local.parts.size_._7_1_ = 0;
      kj::_::Debug::Fault::~Fault(&local_48);
    }
  }
  else {
    sVar3 = PathPtr::size((PathPtr *)&this_local);
    if (sVar3 == 1) {
      bVar1 = has<kj::WriteMode,void>(toMode,MODIFY);
      if (!bVar1) {
        MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
                  ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_70,
                   &this->impl);
        pIVar4 = Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                           ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
                            local_70);
        pSVar5 = PathPtr::operator[]((PathPtr *)&this_local,0);
        StringPtr::StringPtr(&local_88,pSVar5);
        name.content.size_ = (size_t)local_88.content.ptr;
        name.content.ptr = (char *)pIVar4;
        Impl::tryGetEntry((Impl *)(local_70 + 0x10),name);
        bVar1 = Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>::operator==
                          ((Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> *
                           )(local_70 + 0x10));
        Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                  ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_70);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          toPath_local.parts.size_._7_1_ = 0;
          goto LAB_0036ed3c;
        }
      }
      OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
      ::OneOf((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
               *)&meta.hashCode);
      FsNode::Metadata::Metadata((Metadata *)((long)&_m1292.field_1 + 0x28));
      (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[9])
                (&local_158,fromDirectory,fromPath.parts.ptr,fromPath.parts.size_);
      other = kj::_::readMaybe<kj::FsNode::Metadata>(&local_158);
      kj::_::NullableValue<kj::FsNode::Metadata>::NullableValue
                ((NullableValue<kj::FsNode::Metadata> *)local_120,other);
      Maybe<kj::FsNode::Metadata>::~Maybe(&local_158);
      pMVar6 = kj::_::NullableValue::operator_cast_to_Metadata_((NullableValue *)local_120);
      if (pMVar6 == (Metadata *)0x0) {
        toPath_local.parts.size_._7_1_ = 0;
      }
      else {
        __src = kj::_::NullableValue<kj::FsNode::Metadata>::operator*
                          ((NullableValue<kj::FsNode::Metadata> *)local_120);
        memcpy((void *)((long)&_m1292.field_1 + 0x28),__src,0x30);
      }
      file.ptr._5_3_ = 0;
      file.ptr._4_1_ = pMVar6 == (Metadata *)0x0;
      kj::_::NullableValue<kj::FsNode::Metadata>::~NullableValue
                ((NullableValue<kj::FsNode::Metadata> *)local_120);
      if (file.ptr._4_4_ == 0) {
        pSVar5 = fromPath.parts.ptr;
        sVar3 = fromPath.parts.size_;
        if (_m1292.field_1.value.hashCode._0_4_ == 0) {
          (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xd])
                    (&local_1b8,fromDirectory,fromPath.parts.ptr,fromPath.parts.size_,2);
          kj::_::readMaybe<kj::File_const,decltype(nullptr)>((_ *)local_1a8,&local_1b8);
          Maybe<kj::Own<const_kj::File,_std::nullptr_t>_>::~Maybe(&local_1b8);
          pOVar7 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_1a8);
          if (pOVar7 == (Own<const_kj::File,_std::nullptr_t> *)0x0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                      ((Fault *)&copy.ptr,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                       ,0x516,FAILED,
                       "fromDirectory.tryOpenFile(fromPath, WriteMode::MODIFY) != nullptr",
                       "\"source node deleted concurrently during transfer\", fromPath",
                       (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
            kj::_::Debug::Fault::fatal((Fault *)&copy.ptr);
          }
          pOVar8 = mv<kj::_::OwnOwn<kj::File_const,decltype(nullptr)>>
                             ((OwnOwn<const_kj::File,_std::nullptr_t> *)local_1a8);
          kj::_::OwnOwn<const_kj::File,_std::nullptr_t>::OwnOwn
                    ((OwnOwn<const_kj::File,_std::nullptr_t> *)&_kj_result.value.ptr,pOVar8);
          kj::_::OwnOwn<const_kj::File,_std::nullptr_t>::~OwnOwn
                    ((OwnOwn<const_kj::File,_std::nullptr_t> *)local_1a8);
          pOVar7 = kj::_::OwnOwn<const_kj::File,_std::nullptr_t>::operator*
                             ((OwnOwn<const_kj::File,_std::nullptr_t> *)&_kj_result.value.ptr);
          Own<const_kj::File,_std::nullptr_t>::Own
                    ((Own<const_kj::File,_std::nullptr_t> *)local_188,pOVar7);
          kj::_::OwnOwn<const_kj::File,_std::nullptr_t>::~OwnOwn
                    ((OwnOwn<const_kj::File,_std::nullptr_t> *)&_kj_result.value.ptr);
          if (f.exception._4_4_ == COPY) {
            MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::getWithoutLock
                      (&this->impl);
            Impl::newFile((Impl *)local_1e0);
            pFVar9 = Own<const_kj::File,_std::nullptr_t>::operator->
                               ((Own<const_kj::File,_std::nullptr_t> *)local_1e0);
            pFVar10 = Own<const_kj::File,_std::nullptr_t>::operator*
                                ((Own<const_kj::File,_std::nullptr_t> *)local_188);
            (*(pFVar9->super_ReadableFile).super_FsNode._vptr_FsNode[0xd])
                      (pFVar9,0,pFVar10,0,meta._0_8_);
            pOVar7 = mv<kj::Own<kj::File_const,decltype(nullptr)>>
                               ((Own<const_kj::File,_std::nullptr_t> *)local_1e0);
            Own<const_kj::File,_std::nullptr_t>::operator=
                      ((Own<const_kj::File,_std::nullptr_t> *)local_188,pOVar7);
            Own<const_kj::File,_std::nullptr_t>::~Own
                      ((Own<const_kj::File,_std::nullptr_t> *)local_1e0);
          }
          pOVar7 = mv<kj::Own<kj::File_const,decltype(nullptr)>>
                             ((Own<const_kj::File,_std::nullptr_t> *)local_188);
          Own<const_kj::File,_std::nullptr_t>::Own
                    ((Own<const_kj::File,_std::nullptr_t> *)&subdir.ptr,pOVar7);
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,int>
                    ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                      *)&local_208,(FileNode *)&subdir.ptr);
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::operator=((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       *)&meta.hashCode,&local_208);
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::~OneOf(&local_208);
          FileNode::~FileNode((FileNode *)&subdir.ptr);
          file.ptr._4_4_ = 5;
          Own<const_kj::File,_std::nullptr_t>::~Own
                    ((Own<const_kj::File,_std::nullptr_t> *)local_188);
        }
        else if (_m1292.field_1.value.hashCode._0_4_ == 1) {
          local_268 = (_Rb_tree_color)fromPath.parts.ptr;
          uStack_264 = fromPath.parts.ptr._4_4_;
          uStack_260 = (undefined4)fromPath.parts.size_;
          uStack_25c = fromPath.parts.size_._4_4_;
          (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x11])
                    (&local_258,fromDirectory,pSVar5,sVar3,2);
          kj::_::readMaybe<kj::Directory_const,decltype(nullptr)>((_ *)local_248,&local_258);
          Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>::~Maybe(&local_258);
          pOVar11 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_248);
          if (pOVar11 == (Own<const_kj::Directory,_std::nullptr_t> *)0x0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                      ((Fault *)(local_280 + 0x10),
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                       ,0x524,FAILED,
                       "fromDirectory.tryOpenSubdir(fromPath, WriteMode::MODIFY) != nullptr",
                       "\"source node deleted concurrently during transfer\", fromPath",
                       (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
            kj::_::Debug::Fault::fatal((Fault *)(local_280 + 0x10));
          }
          pOVar12 = mv<kj::_::OwnOwn<kj::Directory_const,decltype(nullptr)>>
                              ((OwnOwn<const_kj::Directory,_std::nullptr_t> *)local_248);
          kj::_::OwnOwn<const_kj::Directory,_std::nullptr_t>::OwnOwn
                    ((OwnOwn<const_kj::Directory,_std::nullptr_t> *)&_kj_result_1.value.ptr,pOVar12)
          ;
          kj::_::OwnOwn<const_kj::Directory,_std::nullptr_t>::~OwnOwn
                    ((OwnOwn<const_kj::Directory,_std::nullptr_t> *)local_248);
          pOVar11 = kj::_::OwnOwn<const_kj::Directory,_std::nullptr_t>::operator*
                              ((OwnOwn<const_kj::Directory,_std::nullptr_t> *)
                               &_kj_result_1.value.ptr);
          Own<const_kj::Directory,_std::nullptr_t>::Own
                    ((Own<const_kj::Directory,_std::nullptr_t> *)local_228,pOVar11);
          kj::_::OwnOwn<const_kj::Directory,_std::nullptr_t>::~OwnOwn
                    ((OwnOwn<const_kj::Directory,_std::nullptr_t> *)&_kj_result_1.value.ptr);
          if (f.exception._4_4_ == MOVE) {
            dynamicDowncastIfAvailable<kj::(anonymous_namespace)::InMemoryDirectory_const,kj::Directory_const>
                      ((kj *)&local_288,fromDirectory);
            bVar1 = Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory_&>::operator==
                              (&local_288);
            if (bVar1) {
              pIVar4 = MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::
                       getWithoutLock(&this->impl);
              pDVar13 = Own<const_kj::Directory,_std::nullptr_t>::operator*
                                  ((Own<const_kj::Directory,_std::nullptr_t> *)local_228);
              Impl::copyDirectory((Impl *)local_2a0,(Directory *)pIVar4,SUB81(pDVar13,0));
              Own<const_kj::Directory,_std::nullptr_t>::operator=
                        ((Own<const_kj::Directory,_std::nullptr_t> *)local_228,
                         (Own<const_kj::Directory,_std::nullptr_t> *)local_2a0);
              Own<const_kj::Directory,_std::nullptr_t>::~Own
                        ((Own<const_kj::Directory,_std::nullptr_t> *)local_2a0);
            }
          }
          else if ((f.exception._4_4_ != LINK) && (f.exception._4_4_ == COPY)) {
            pIVar4 = MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::
                     getWithoutLock(&this->impl);
            pDVar13 = Own<const_kj::Directory,_std::nullptr_t>::operator*
                                ((Own<const_kj::Directory,_std::nullptr_t> *)local_228);
            Impl::copyDirectory((Impl *)local_280,(Directory *)pIVar4,SUB81(pDVar13,0));
            Own<const_kj::Directory,_std::nullptr_t>::operator=
                      ((Own<const_kj::Directory,_std::nullptr_t> *)local_228,
                       (Own<const_kj::Directory,_std::nullptr_t> *)local_280);
            Own<const_kj::Directory,_std::nullptr_t>::~Own
                      ((Own<const_kj::Directory,_std::nullptr_t> *)local_280);
          }
          pOVar11 = mv<kj::Own<kj::Directory_const,decltype(nullptr)>>
                              ((Own<const_kj::Directory,_std::nullptr_t> *)local_228);
          this_00 = &link.content.disposer;
          Own<const_kj::Directory,_std::nullptr_t>::Own
                    ((Own<const_kj::Directory,_std::nullptr_t> *)this_00,pOVar11);
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::OneOf<kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,int>
                    ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                      *)&local_2c8,(DirectoryNode *)this_00);
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::operator=((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       *)&meta.hashCode,&local_2c8);
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::~OneOf(&local_2c8);
          DirectoryNode::~DirectoryNode((DirectoryNode *)&link.content.disposer);
          file.ptr._4_4_ = 5;
          Own<const_kj::Directory,_std::nullptr_t>::~Own
                    ((Own<const_kj::Directory,_std::nullptr_t> *)local_228);
        }
        else {
          if (_m1292.field_1.value.hashCode._0_4_ != 2) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51],kj::PathPtr&>
                      ((Fault *)&stack0xfffffffffffffc40,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                       ,0x54f,FAILED,(char *)0x0,
                       "\"InMemoryDirectory can\'t link an inode of this type\", fromPath",
                       (char (*) [51])"InMemoryDirectory can\'t link an inode of this type",
                       &fromPath);
            kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffc40);
          }
          local_368 = (_Rb_tree_color)fromPath.parts.ptr;
          uStack_364 = fromPath.parts.ptr._4_4_;
          uStack_360 = (undefined4)fromPath.parts.size_;
          uStack_35c = fromPath.parts.size_._4_4_;
          (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xc])
                    (&local_350,fromDirectory,pSVar5,sVar3);
          pNVar14 = kj::_::readMaybe<kj::String>(&local_350);
          kj::_::NullableValue<kj::String>::NullableValue
                    ((NullableValue<kj::String> *)local_330,pNVar14);
          Maybe<kj::String>::~Maybe(&local_350);
          pSVar5 = kj::_::NullableValue::operator_cast_to_String_((NullableValue *)local_330);
          if (pSVar5 == (String *)0x0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                      (&local_370,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                       ,0x549,FAILED,"fromDirectory.tryReadlink(fromPath) != nullptr",
                       "\"source node deleted concurrently during transfer\", fromPath",
                       (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
            kj::_::Debug::Fault::fatal(&local_370);
          }
          pNVar14 = mv<kj::_::NullableValue<kj::String>>((NullableValue<kj::String> *)local_330);
          kj::_::NullableValue<kj::String>::NullableValue
                    ((NullableValue<kj::String> *)&_kj_result_2.field_1.value.content.disposer,
                     pNVar14);
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_330);
          pSVar5 = kj::_::NullableValue<kj::String>::operator*
                             ((NullableValue<kj::String> *)
                              &_kj_result_2.field_1.value.content.disposer);
          String::String((String *)local_2f0,pSVar5);
          kj::_::NullableValue<kj::String>::~NullableValue
                    ((NullableValue<kj::String> *)&_kj_result_2.field_1.value.content.disposer);
          f_1.exception = (Exception *)meta.spaceUsed;
          pSVar5 = mv<kj::String>((String *)local_2f0);
          String::String(&local_3b0,pSVar5);
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::OneOf<kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode,int>
                    ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                      *)&local_398,(SymlinkNode *)&f_1);
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::operator=((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       *)&meta.hashCode,&local_398);
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::~OneOf(&local_398);
          SymlinkNode::~SymlinkNode((SymlinkNode *)&f_1);
          file.ptr._4_4_ = 5;
          String::~String((String *)local_2f0);
        }
        if (f.exception._4_4_ == MOVE) {
          iVar2 = (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x16])
                            (fromDirectory,fromPath.parts.ptr,fromPath.parts.size_);
          local_3c2 = (bool)((byte)iVar2 & 1);
          local_3c1 = kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3c2);
          bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_3c1);
          if (!bVar1) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[19],kj::PathPtr&>
                      ((Fault *)&lock.ptr,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                       ,0x553,FAILED,"fromDirectory.tryRemove(fromPath)",
                       "_kjCondition,\"couldn\'t move node\", fromPath",&local_3c1,
                       (char (*) [19])"couldn\'t move node",&fromPath);
            kj::_::Debug::Fault::fatal((Fault *)&lock.ptr);
          }
        }
        MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockExclusive
                  ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_3f0,
                   &this->impl);
        pIVar4 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                           ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_3f0)
        ;
        pSVar5 = PathPtr::operator[]((PathPtr *)&this_local,0);
        StringPtr::StringPtr((StringPtr *)&targetEntry,pSVar5);
        name_00.content.size_ = (size_t)targetEntry;
        name_00.content.ptr = (char *)pIVar4;
        Impl::openEntry((Impl *)local_408,name_00,local_410);
        this_01 = kj::_::readMaybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>
                            ((Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> *)
                             local_408);
        local_408._8_8_ = this_01;
        if (this_01 == (EntryImpl *)0x0) {
          toPath_local.parts.size_._7_1_ = 0;
        }
        else {
          _child1382.value.ptr = (Directory *)this_01;
          ctx = mv<kj::OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>>
                          ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                            *)&meta.hashCode);
          EntryImpl::init(this_01,(EVP_PKEY_CTX *)ctx);
          pIVar4 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                             ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
                              local_3f0);
          Impl::modified(pIVar4);
        }
        file.ptr._5_3_ = 0;
        file.ptr._4_1_ = this_01 == (EntryImpl *)0x0;
        Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                  ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_3f0);
        if (file.ptr._4_4_ == 0) {
          toPath_local.parts.size_._7_1_ = 1;
          file.ptr._4_4_ = 1;
        }
      }
      OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
      ::~OneOf((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                *)&meta.hashCode);
    }
    else {
      pSVar5 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr((StringPtr *)&child,pSVar5);
      name_01.content.size_ = (size_t)child;
      name_01.content.ptr = (char *)this;
      tryGetParent((InMemoryDirectory *)local_440,name_01,local_448);
      kj::_::readMaybe<kj::Directory_const,decltype(nullptr)>
                ((_ *)local_430,(Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> *)local_440);
      Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>::~Maybe
                ((Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> *)local_440);
      pOVar11 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_430);
      if (pOVar11 == (Own<const_kj::Directory,_std::nullptr_t> *)0x0) {
        toPath_local.parts.size_._7_1_ = 0;
      }
      else {
        pOVar11 = kj::_::OwnOwn<const_kj::Directory,_std::nullptr_t>::operator*
                            ((OwnOwn<const_kj::Directory,_std::nullptr_t> *)local_430);
        pDVar15 = Own<const_kj::Directory,_std::nullptr_t>::operator->(pOVar11);
        sVar3 = PathPtr::size((PathPtr *)&this_local);
        PVar16 = PathPtr::slice((PathPtr *)&this_local,1,sVar3);
        iVar2 = (*(pDVar15->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x14])
                          (pDVar15,PVar16.parts.ptr,PVar16.parts.size_,(ulong)toMode,fromDirectory,
                           (ulong)f.exception._4_4_,fromPath.parts.ptr,fromPath.parts.size_);
        toPath_local.parts.size_._7_1_ = (byte)iVar2 & 1;
      }
      file.ptr._4_4_ = 1;
      kj::_::OwnOwn<const_kj::Directory,_std::nullptr_t>::~OwnOwn
                ((OwnOwn<const_kj::Directory,_std::nullptr_t> *)local_430);
    }
  }
LAB_0036ed3c:
  return (bool)(toPath_local.parts.size_._7_1_ & 1);
}

Assistant:

bool tryTransfer(PathPtr toPath, WriteMode toMode,
                   const Directory& fromDirectory, PathPtr fromPath,
                   TransferMode mode) const override {
    if (toPath.size() == 0) {
      if (has(toMode, WriteMode::CREATE)) {
        return false;
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return false; }
      }
    } else if (toPath.size() == 1) {
      if (!has(toMode, WriteMode::MODIFY)) {
        // Replacement is not allowed, so we'll have to check upfront if the target path exists.
        // Unfortunately we have to take a lock and then drop it immediately since we can't keep
        // the lock held while accessing `fromDirectory`.
        if (impl.lockShared()->tryGetEntry(toPath[0]) != kj::none) {
          return false;
        }
      }

      OneOf<FileNode, DirectoryNode, SymlinkNode> newNode;
      FsNode::Metadata meta;
      KJ_IF_SOME(m, fromDirectory.tryLstat(fromPath)) {
        meta = m;
      } else {
        return false;
      }

      switch (meta.type) {
        case FsNode::Type::FILE: {
          auto file = KJ_ASSERT_NONNULL(
              fromDirectory.tryOpenFile(fromPath, WriteMode::MODIFY),
              "source node deleted concurrently during transfer", fromPath);

          if (mode == TransferMode::COPY) {
            auto copy = impl.getWithoutLock().newFile();
            copy->copy(0, *file, 0, meta.size);
            file = kj::mv(copy);
          }

          newNode = FileNode { kj::mv(file) };
          break;
        }
        case FsNode::Type::DIRECTORY: {
          auto subdir = KJ_ASSERT_NONNULL(
              fromDirectory.tryOpenSubdir(fromPath, WriteMode::MODIFY),
              "source node deleted concurrently during transfer", fromPath);

          switch (mode) {
            case TransferMode::COPY:
              // Copying is straightforward: Make a deep copy of the entire directory tree,
              // including file contents.
              subdir = impl.getWithoutLock().copyDirectory(*subdir, /* copyFiles = */ true);
              break;

            case TransferMode::LINK:
              // To "link", we can safely just place `subdir` directly into our own tree.
              break;

            case TransferMode::MOVE:
              // Moving may be tricky:
              //
              // If `fromDirectory` is an `InMemoryDirectory`, then we know that removing the
              // subdir just unlinks the object without modifying it, so we can safely just link it
              // into our own tree.
              //
              // However, if `fromDirectory` is a disk directory, then removing the subdir will
              // likely perform a recursive delete, thus leaving `subdir` pointing to an empty
              // directory. If we link that into our tree, it's useless. So, instead, perform a
              // deep copy of the directory tree upfront, into an InMemoryDirectory. However, file
              // content need not be copied, since unlinked files keep their contents until closed.
              if (kj::dynamicDowncastIfAvailable<const InMemoryDirectory>(fromDirectory) ==
                  kj::none) {
                subdir = impl.getWithoutLock().copyDirectory(*subdir, /* copyFiles = */ false);
              }
              break;
          }

          newNode = DirectoryNode { kj::mv(subdir) };
          break;
        }
        case FsNode::Type::SYMLINK: {
          auto link = KJ_ASSERT_NONNULL(fromDirectory.tryReadlink(fromPath),
              "source node deleted concurrently during transfer", fromPath);

          newNode = SymlinkNode {meta.lastModified, kj::mv(link)};
          break;
        }
        default:
          KJ_FAIL_REQUIRE("InMemoryDirectory can't link an inode of this type", fromPath);
      }

      if (mode == TransferMode::MOVE) {
        KJ_ASSERT(fromDirectory.tryRemove(fromPath), "couldn't move node", fromPath);
      }

      // Take the lock to insert the entry into our map. Remember that it's important we do not
      // manipulate `fromDirectory` while the lock is held, since it could be the same directory.
      {
        auto lock = impl.lockExclusive();
        KJ_IF_SOME(targetEntry, lock->openEntry(toPath[0], toMode)) {
          targetEntry.init(kj::mv(newNode));;
        } else {
          return false;
        }
        lock->modified();
      }

      return true;
    } else {
      // TODO(someday): Ideally we wouldn't create parent directories if fromPath doesn't exist.
      //   This requires a different approach to the code here, though.
      KJ_IF_SOME(child, tryGetParent(toPath[0], toMode)) {
        return child->tryTransfer(
            toPath.slice(1, toPath.size()), toMode, fromDirectory, fromPath, mode);
      } else {
        return false;
      }
    }
  }